

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extract.cpp
# Opt level: O0

void anon_unknown.dwarf_2b41b::print_filter_info(item *item,bool temp)

{
  ulong uVar1;
  ostream *poVar2;
  byte in_SIL;
  long in_RDI;
  bool first;
  ostream *in_stack_ffffffffffffffc8;
  char *os;
  shell_command in_stack_ffffffffffffffd0;
  bool local_a;
  
  uVar1 = std::__cxx11::string::empty();
  local_a = (uVar1 & 1) == 0;
  if (local_a) {
    std::operator<<((ostream *)&std::cout," [");
    poVar2 = color::operator<<(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
    std::operator<<(poVar2,(string *)(in_RDI + 0x40));
    color::operator<<(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0);
  }
  local_a = !local_a;
  if ((in_SIL & 1) != 0) {
    if (local_a) {
      os = " [";
    }
    else {
      os = ", ";
    }
    std::operator<<((ostream *)&std::cout,os);
    local_a = false;
    poVar2 = color::operator<<((ostream *)os,in_stack_ffffffffffffffd0);
    std::operator<<(poVar2,"temp");
    color::operator<<((ostream *)os,(shell_command)color::reset);
  }
  if (!local_a) {
    std::operator<<((ostream *)&std::cout,"]");
  }
  return;
}

Assistant:

void print_filter_info(const setup::item & item, bool temp) {
	
	bool first = true;
	
	if(!item.languages.empty()) {
		std::cout << " [";
		first = false;
		std::cout << color::green << item.languages << color::reset;
	}
	
	if(temp) {
		std::cout << (first ? " [" : ", ");
		first = false;
		std::cout << color::cyan << "temp" << color::reset;
		
	}
	
	if(!first) {
		std::cout << "]";
	}
	
}